

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O0

vm_obj_id_t CVmObjFrameDesc::create(vm_obj_id_t fref,int frame_idx,uint ret_ofs)

{
  vm_obj_id_t vVar1;
  uint in_EDX;
  int in_ESI;
  vm_obj_id_t in_EDI;
  CVmObjFrameDesc *unaff_retaddr;
  vm_obj_id_t id;
  vm_obj_id_t in_stack_ffffffffffffffec;
  int in_stack_fffffffffffffff0;
  
  vVar1 = vm_new_id(in_EDX,in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  CVmObject::operator_new(CONCAT44(in_EDX,vVar1),in_stack_ffffffffffffffec);
  CVmObjFrameDesc(unaff_retaddr,in_EDI,in_ESI,in_EDX);
  return vVar1;
}

Assistant:

vm_obj_id_t CVmObjFrameDesc::create(
    VMG_ vm_obj_id_t fref, int frame_idx, uint ret_ofs)
{
    /* allocate an object ID */
    vm_obj_id_t id = vm_new_id(vmg_ FALSE, TRUE, FALSE);

    /* instantiate the new object */
    new (vmg_ id) CVmObjFrameDesc(vmg_ fref, frame_idx, ret_ofs);

    /* return the new object's ID */
    return id;
}